

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReaderCache::purge(PtexReaderCache *this,PtexCachedReader *reader)

{
  bool bVar1;
  PtexReaderCache *in_RSI;
  size_t *in_RDI;
  size_t memUsedChange;
  PtexCachedReader *in_stack_ffffffffffffffe8;
  
  bVar1 = PtexCachedReader::tryPurge(in_stack_ffffffffffffffe8,in_RDI);
  if (bVar1) {
    adjustMemUsed(in_RSI,(size_t)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void PtexReaderCache::purge(PtexCachedReader* reader)
{
    size_t memUsedChange;
    if (reader->tryPurge(memUsedChange)) {
        adjustMemUsed(memUsedChange);
    }
}